

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O1

void * file_stdio_fopen(char *path,char *mode)

{
  _Bool _Var1;
  FILE *__stream;
  undefined8 *puVar2;
  int *piVar3;
  
  _Var1 = _al_trace_prefix("stdio",0,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                           ,0x6e,"file_stdio_fopen");
  if (_Var1) {
    _al_trace_suffix("opening %s %s\n",path,mode);
  }
  __stream = fopen(path,mode);
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    al_set_errno(*piVar3);
  }
  else {
    puVar2 = (undefined8 *)
             al_malloc_with_context
                       (0x60,0x81,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                        ,"file_stdio_fopen");
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = __stream;
      *(undefined4 *)(puVar2 + 1) = 0;
      return puVar2;
    }
    fclose(__stream);
  }
  return (void *)0x0;
}

Assistant:

static void *file_stdio_fopen(const char *path, const char *mode)
{
   FILE *fp;
   USERDATA *userdata;

   ALLEGRO_DEBUG("opening %s %s\n", path, mode);

#ifdef ALLEGRO_WINDOWS
   {
      wchar_t *wpath = _al_win_utf8_to_utf16(path);
      wchar_t *wmode = _al_win_utf8_to_utf16(mode);
      fp = _wfopen(wpath, wmode);
      al_free(wpath);
      al_free(wmode);
   }
#else
   fp = fopen(path, mode);
#endif

   if (!fp) {
      al_set_errno(errno);
      return NULL;
   }

   userdata = al_malloc(sizeof(USERDATA));
   if (!userdata) {
      fclose(fp);
      return NULL;
   }

   userdata->fp = fp;
   userdata->errnum = 0;

   return userdata;
}